

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

char16 * __thiscall Js::ConcatStringMulti::GetSz(ConcatStringMulti *this)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  
  uVar4 = (ulong)this->slotCount;
  do {
    if (uVar4 == 0) goto LAB_00b2e635;
    pTVar1 = &this->__alignmentPTR + uVar4;
    uVar4 = uVar4 - 1;
  } while (*pTVar1 != 0);
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                              ,0x21e,"(IsFilled())","IsFilled()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00b2e635:
  pcVar6 = ConcatStringBase::GetSzImpl<Js::ConcatStringMulti>((ConcatStringBase *)this);
  memset(this + 1,0,(ulong)this->slotCount << 3);
  *(INT_PTR *)this = VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address;
  Memory::Recycler::WBSetBit((char *)&this->__alignment);
  *(undefined8 *)&this->__alignment = 0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->__alignment);
  return pcVar6;
}

Assistant:

const char16 *
    ConcatStringMulti::GetSz()
    {
        Assert(IsFilled());
        const char16 * sz = GetSzImpl<ConcatStringMulti>();

        // Allow slots to be garbage collected if no more refs.
        ClearArray(m_slots, slotCount);

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }